

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O2

Bool Ppmd8_Alloc(CPpmd8 *p,UInt32 size)

{
  Byte *pBVar1;
  Bool BVar2;
  UInt32 UVar3;
  
  BVar2 = 1;
  if ((p->Base == (Byte *)0x0) || (p->Size != size)) {
    Ppmd8_Free(p);
    UVar3 = 4 - (size & 3);
    p->AlignOffset = UVar3;
    pBVar1 = (Byte *)malloc((ulong)(UVar3 + size));
    p->Base = pBVar1;
    if (pBVar1 == (Byte *)0x0) {
      BVar2 = 0;
    }
    else {
      p->Size = size;
    }
  }
  return BVar2;
}

Assistant:

Bool Ppmd8_Alloc(CPpmd8 *p, UInt32 size)
{
  if (p->Base == 0 || p->Size != size)
  {
    Ppmd8_Free(p);
    p->AlignOffset =
      #ifdef PPMD_32BIT
        (4 - size) & 3;
      #else
        4 - (size & 3);
      #endif
    if ((p->Base = malloc(p->AlignOffset + size)) == 0)
      return False;
    p->Size = size;
  }
  return True;
}